

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMagCal.cpp
# Opt level: O0

void __thiscall RTIMUMagCal::newEllipsoidData(RTIMUMagCal *this,RTVector3 *data)

{
  int iVar1;
  RTVector3 *pRVar2;
  RTFLOAT RVar3;
  RTFLOAT RVar4;
  RTFLOAT RVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  int local_30;
  int local_2c;
  int i_1;
  int index;
  int i;
  RTVector3 calData;
  RTVector3 *data_local;
  RTIMUMagCal *this_local;
  
  calData.m_data._4_8_ = data;
  RTVector3::RTVector3((RTVector3 *)&index);
  for (i_1 = 0; i_1 < 3; i_1 = i_1 + 1) {
    RVar3 = RTVector3::data((RTVector3 *)calData.m_data._4_8_,i_1);
    RVar4 = RTVector3::data(&this->m_minMaxOffset,i_1);
    RVar5 = RTVector3::data(&this->m_minMaxScale,i_1);
    RTVector3::setData((RTVector3 *)&index,i_1,(RVar3 - RVar4) * RVar5);
  }
  local_2c = this->m_magCalOutIndex;
  local_30 = 0;
  do {
    if (this->m_magCalCount <= local_30) {
      iVar1 = findOctant(this,(RTVector3 *)&index);
      this->m_octantCounts[iVar1] = this->m_octantCounts[iVar1] + 1;
      iVar1 = this->m_magCalInIndex;
      this->m_magCalInIndex = iVar1 + 1;
      RTVector3::operator=(&this->m_magMax + (long)iVar1 + 2,(RTVector3 *)&index);
      if (this->m_magCalInIndex == 20000) {
        this->m_magCalInIndex = 0;
      }
      iVar1 = this->m_magCalCount + 1;
      this->m_magCalCount = iVar1;
      if (iVar1 == 20000) {
        removeMagCalData(this);
      }
      return;
    }
    RTVector3::x((RTVector3 *)&index);
    pRVar2 = &this->m_magMax + (long)local_2c + 2;
    RTVector3::x(pRVar2);
    std::abs((int)pRVar2);
    if (extraout_XMM0_Da < 0.1) {
      RTVector3::y((RTVector3 *)&index);
      pRVar2 = &this->m_magMax + (long)local_2c + 2;
      RTVector3::y(pRVar2);
      std::abs((int)pRVar2);
      if (extraout_XMM0_Da_00 < 0.1) {
        RTVector3::z((RTVector3 *)&index);
        pRVar2 = &this->m_magMax + (long)local_2c + 2;
        RTVector3::z(pRVar2);
        std::abs((int)pRVar2);
        if (extraout_XMM0_Da_01 < 0.1) {
          return;
        }
      }
    }
    local_2c = local_2c + 1;
    if (local_2c == 20000) {
      local_2c = 0;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void RTIMUMagCal::newEllipsoidData(const RTVector3& data)
{
    RTVector3 calData;

    //  do min/max calibration first

    for (int i = 0; i < 3; i++)
        calData.setData(i, (data.data(i) - m_minMaxOffset.data(i)) * m_minMaxScale.data(i));

    //  now see if it's already there - we want them all unique and slightly separate (using a fuzzy compare)

    for (int index = m_magCalOutIndex, i = 0; i < m_magCalCount; i++) {
        if ((abs(calData.x() - m_magCalSamples[index].x()) < RTIMUCALDEFS_ELLIPSOID_MIN_SPACING) &&
            (abs(calData.y() - m_magCalSamples[index].y()) < RTIMUCALDEFS_ELLIPSOID_MIN_SPACING) &&
            (abs(calData.z() - m_magCalSamples[index].z()) < RTIMUCALDEFS_ELLIPSOID_MIN_SPACING)) {
                return;                                         // too close to another sample
        }
        if (++index == RTIMUCALDEFS_MAX_MAG_SAMPLES)
            index = 0;
    }


    m_octantCounts[findOctant(calData)]++;

    m_magCalSamples[m_magCalInIndex++] = calData;
    if (m_magCalInIndex == RTIMUCALDEFS_MAX_MAG_SAMPLES)
        m_magCalInIndex = 0;

    if (++m_magCalCount == RTIMUCALDEFS_MAX_MAG_SAMPLES) {
        // buffer is full - pull oldest
        removeMagCalData();
    }
}